

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_libpdreceive.c
# Opt level: O3

void * libpdreceive_donew(t_symbol *s)

{
  t_pd *x;
  
  x = pd_new(libpdrec_class);
  x[6] = (t_pd)s;
  x[7] = (t_pd)&libpd_mainimp;
  pd_bind(x,s);
  return x;
}

Assistant:

static void *libpdreceive_donew(t_symbol *s) {
  t_libpdrec *x;
  x = (t_libpdrec *)pd_new(libpdrec_class);
  x->x_sym = s;
  x->x_hooks = &LIBPDSTUFF->i_hooks;
  pd_bind(&x->x_obj.ob_pd, s);
  return x;
}